

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex<short[1]>
          (Simplex_tree<MiniSTOptions> *this,short (*simplex) [1],Filtration_value *filtration)

{
  short *__first;
  short *__last;
  iterator __first_00;
  iterator __last_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar2;
  allocator<short> local_61;
  undefined1 local_60 [8];
  vector<short,_std::allocator<short>_> copy;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>
  local_40;
  short *local_38;
  short *last;
  short *first;
  Filtration_value *filtration_local;
  short (*simplex_local) [1];
  Simplex_tree<MiniSTOptions> *this_local;
  
  filtration_local = filtration;
  simplex_local = simplex;
  this_local = this;
  last = std::begin<short_const,1ul>((short (*) [1])filtration);
  __last = std::end<short_const,1ul>((short (*) [1])filtration_local);
  __first = last;
  local_38 = __last;
  if (last == __last) {
    null_simplex();
    copy.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    std::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
                *)this,&local_40,
               (bool *)((long)&copy.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    uVar1 = extraout_RDX;
  }
  else {
    std::allocator<short>::allocator(&local_61);
    std::vector<short,std::allocator<short>>::vector<short_const*,void>
              ((vector<short,std::allocator<short>> *)local_60,__first,__last,&local_61);
    std::allocator<short>::~allocator(&local_61);
    __first_00 = std::begin<std::vector<short,std::allocator<short>>>
                           ((vector<short,_std::allocator<short>_> *)local_60);
    __last_00 = std::end<std::vector<short,std::allocator<short>>>
                          ((vector<short,_std::allocator<short>_> *)local_60);
    std::sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               __first_00._M_current,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               __last_00._M_current);
    insert_simplex_raw<std::vector<short,std::allocator<short>>>
              (this,(vector<short,_std::allocator<short>_> *)simplex,(Filtration_value *)local_60);
    std::vector<short,_std::allocator<short>_>::~vector
              ((vector<short,_std::allocator<short>_> *)local_60);
    uVar1 = extraout_RDX_00;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar2;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }